

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<notch::core::ActivationLayer> __thiscall
notch::core::ActivationLayer::makeClone(ActivationLayer *this)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  int in_ECX;
  void *__child_stack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  void *in_R8;
  shared_ptr<notch::core::ActivationLayer> sVar3;
  SharedBuffers local_50;
  undefined1 local_19;
  ActivationLayer *this_local;
  shared_ptr<notch::core::ActivationLayer> *p;
  
  local_19 = 0;
  this_local = this;
  ::std::make_shared<notch::core::ActivationLayer,notch::core::ActivationLayer_const&>(this);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    SharedBuffers::clone(&local_50,(__fn *)(in_RSI + 8),__child_stack,in_ECX,in_R8);
    peVar2 = std::
             __shared_ptr_access<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    SharedBuffers::operator=(&(peVar2->super_ABackpropLayer).shared,&local_50);
    SharedBuffers::~SharedBuffers(&local_50);
    sVar3.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
    ;
    return (shared_ptr<notch::core::ActivationLayer>)
           sVar3.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"cannot clone ActivationLayer");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ActivationLayer> makeClone() const {
        auto p = std::make_shared<ActivationLayer>(*this);
        if (!p) {
            throw std::runtime_error("cannot clone ActivationLayer");
        }
        p->shared = shared.clone();
        return p;
    }